

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robot.cpp
# Opt level: O2

Joint * __thiscall
Robot::IK(Joint *__return_storage_ptr__,Robot *this,Pose *p,Joint jAct,bool bFrontBack,bool bUpDown)

{
  Brand BVar1;
  double dVar2;
  double __y;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar3;
  ostream *poVar4;
  char *pcVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double RZ;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_2c0;
  Matrix3d *local_2b8;
  Matrix3d Rwrist;
  Vector3d WP;
  Pose MP;
  Vector3d x_hat;
  Matrix3d Rarm;
  Vector3d local_1a0;
  Pose pJ23;
  Pose pJ1;
  Pose Rtmp;
  Matrix3d local_c0;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> local_78 [72];
  
  Pose::Pose(&MP);
  Pose::Pose(&Rtmp);
  BVar1 = this->brand;
  if (BVar1 == KUKA) {
    pcVar5 = "IK KUKA\n";
  }
  else {
    if (BVar1 == ABB) {
      std::operator<<((ostream *)&std::cout,"IK ABB\n");
      Pose::getpos(p);
      Pose::setpos(&MP,&local_1a0);
      Pose::setrot(&Rtmp,0.0,1.5707963267948966,0.0);
      Pose::getR(&Rarm,p);
      Pose::getR(&Rwrist,&Rtmp);
      local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)&Rarm;
      local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = (double)&Rwrist;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
      _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
                (local_78,(DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
                           *)&local_c0);
      Pose::setrot(&MP,(Matrix3d *)local_78);
      goto LAB_001149bd;
    }
    if (BVar1 != IR) goto LAB_001149bd;
    pcVar5 = "IK IR\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar5);
  Pose::operator=(&MP,p);
LAB_001149bd:
  Pose::getR(&Rarm,&MP);
  Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       4.94065645841247e-324;
  local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  pJ23.pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_c0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&Rwrist,
                      (Scalar *)&pJ23);
  local_2c0 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (pCVar3,(Scalar *)&local_2c0);
  pJ1.pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished(pCVar3);
  pJ1.pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&Rarm;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            (&x_hat,(Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                     *)&pJ1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&Rwrist);
  Pose::getpos(&MP);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&Rwrist,&this->a6x,(StorageBaseType *)&x_hat);
  Rarm.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
  ;
  Rarm.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
  ;
  Rarm.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_c0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&WP,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&Rarm);
  if ((0.001 <= ABS(WP.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array[0])) ||
     (0.001 <= ABS(WP.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1]))) {
    RZ = atan2(WP.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[1],WP.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[0]);
    if (bFrontBack) {
      if (RZ <= 0.0) {
        RZ = RZ + 3.141592653589793;
      }
      else {
        RZ = RZ + -3.141592653589793;
      }
    }
  }
  else {
    RZ = Joint::getj1(&jAct);
  }
  uVar6 = (uint)((ulong)this->a2x >> 0x20);
  if (!bFrontBack) {
    uVar6 = uVar6 ^ 0x80000000;
  }
  dVar7 = (WP.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
          - this->a1z) - this->a2z;
  dVar8 = this->a4x + this->a5x;
  dVar2 = (double)CONCAT44(uVar6,SUB84(this->a2x,0)) +
          SQRT(WP.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[1] *
               WP.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[1] +
               WP.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[0] *
               WP.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[0]);
  auVar11._0_8_ = dVar7 * dVar7 + dVar2 * dVar2;
  auVar11._8_8_ = dVar8 * dVar8 + this->a4z * this->a4z;
  auVar11 = sqrtpd(auVar11,auVar11);
  dVar12 = auVar11._8_8_;
  dVar8 = auVar11._0_8_;
  if (this->a3z + dVar12 <= dVar8) {
    pcVar5 = "Error: impossible to reach that point";
  }
  else {
    if (ABS(this->a3z - dVar12) < dVar8) {
      dVar2 = atan2(dVar7,dVar2);
      dVar7 = this->a3z;
      dVar9 = ((dVar7 * dVar7 + dVar8 * dVar8) - dVar12 * dVar12) / ((dVar8 + dVar8) * dVar7);
      dVar7 = 1.0 - dVar9 * dVar9;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar7 = atan2(dVar7,dVar9);
      uVar6 = (uint)((ulong)dVar7 >> 0x20);
      if (!bUpDown) {
        uVar6 = uVar6 ^ 0x80000000;
      }
      dVar9 = (1.5707963267948966 - dVar2) + (double)CONCAT44(uVar6,SUB84(dVar7,0));
      dVar7 = this->a3z;
      dVar2 = ((dVar12 * dVar12 + dVar7 * dVar7) - dVar8 * dVar8) / (dVar12 * (dVar7 + dVar7));
      dVar7 = 1.0 - dVar2 * dVar2;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar7 = atan2(dVar7,dVar2);
      dVar2 = atan2(this->a4x + this->a5x,this->a4z);
      dVar2 = (3.141592653589793 - dVar7) - dVar2;
      Pose::Pose(&pJ1);
      Pose::Pose(&pJ23);
      Pose::setrot(&pJ1,0.0,0.0,RZ);
      Pose::setrot(&pJ23,0.0,dVar9 + dVar2,0.0);
      Pose::getR(&Rwrist,&pJ1);
      Pose::getR(&local_c0,&pJ23);
      local_2c0 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)&Rwrist;
      local_2b8 = &local_c0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
      _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&Rarm,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                  *)&local_2c0);
      Pose::getR(&local_c0,&MP);
      local_2c0 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)&Rarm;
      local_2b8 = &local_c0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
      _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&Rwrist,
                 (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                  *)&local_2c0);
      __y = Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3];
      dVar12 = Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
               array[2];
      dVar8 = Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array[1];
      dVar7 = Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array[0];
      if (0.9999999 <=
          Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          [0]) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Rwrist11 = +1");
        std::endl<char,std::char_traits<char>>(poVar4);
        dVar7 = Joint::getj4(&jAct);
        dVar8 = atan2(Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array[5],
                      Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array[8]);
        dVar8 = dVar8 - dVar7;
        dVar10 = 0.0;
      }
      else if (Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
               array[0] <= -0.9999999) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Rwrist11 = -1");
        std::endl<char,std::char_traits<char>>(poVar4);
        dVar7 = Joint::getj4(&jAct);
        dVar8 = atan2(Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array[5],
                      Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array[8]);
        dVar8 = dVar8 + dVar7;
        dVar10 = 3.141592653589793;
      }
      else {
        dVar10 = 1.0 - Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                       .m_data.array[0] *
                       Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                       .m_data.array[0];
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        dVar10 = atan2(dVar10,dVar7);
        dVar7 = atan2(dVar8,-dVar12);
        dVar8 = atan2(__y,Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[6]);
      }
      Joint::Joint(__return_storage_ptr__,RZ,dVar9,dVar2,dVar7,dVar10,dVar8);
      return __return_storage_ptr__;
    }
    pcVar5 = "Error: J2 too small";
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  __return_storage_ptr__->j1 = jAct.j1;
  __return_storage_ptr__->j2 = jAct.j2;
  __return_storage_ptr__->j3 = jAct.j3;
  __return_storage_ptr__->j4 = jAct.j4;
  __return_storage_ptr__->j5 = jAct.j5;
  __return_storage_ptr__->j6 = jAct.j6;
  return __return_storage_ptr__;
}

Assistant:

Joint Robot::IK(Pose p, Joint jAct, bool bFrontBack, bool bUpDown){
    double J1, J2, J3, J4, J5, J6;
    double Rwrist11, Rwrist21, Rwrist31, Rwrist12, Rwrist13, Rwrist32, Rwrist33;
    double WPxy, l, h;
    double rho, b4x;
    double alpha, beta, gamma, delta;
    double cos_beta, sin_beta;
    Vector3d x_hat, WP;
    //Pose of the mounting point (center of the axe 6)
    Pose MP;
    Pose Rtmp;

    switch(this->brand)
    {
        case IR:
            std::cout << "IK IR\n";
            MP = p;
            break;
        case ABB:
            std::cout << "IK ABB\n";
            // Mounting point MP (Center of the flange of axis 6)      
            MP.setpos(p.getpos());
            // Rotation 90° around Y
            Rtmp.setrot(0.0, M_PI/2.0, 0.0);
            MP.setrot(p.getR() * Rtmp.getR().transpose());
            break;
        case KUKA:
            std::cout << "IK KUKA\n";
            MP = p;
            break;
    }

    x_hat = MP.getR() * ((Vector3d() << 1, 0, 0).finished());
    WP = MP.getpos() - (this->a6x * x_hat);

    // Find J1
    // Check if there is a shoulder singularity
    if((abs(WP(0)) < 0.001) && (abs(WP(1)) < 0.001)){
        // In this case we have a shoulder singularity.
        // Fix J1 as the actual value of J1
        J1 = jAct.getj1();
    }
    else{
        // FRONT solution
        J1 = atan2(WP(1), WP(0));
        // To have the BACK solution I need to add or substract pi
        if(bFrontBack){
            // BACK solution is selected
            if(J1 > 0)
                J1 -= M_PI;
            else
                J1 += M_PI;
        }
    }

    // Find J2 and J3
    WPxy = sqrt( pow(WP(0),2) + pow(WP(1),2) );
    //std::cout << "WPxy:\n" << WPxy << std::endl;

    if(bFrontBack){
        // BACK solution
        l = WPxy + this->a2x;
    }
    else{
        // FRONT solution
        l = WPxy - this->a2x;
    }
    //std::cout << "l:\n" << l << std::endl;
    h = WP(2) - this->a1z - this->a2z;
    //std::cout << "h:\n" << h << std::endl;

    rho = sqrt( pow(h,2) + pow(l,2) );
    //std::cout << "rho:\n" << rho << std::endl;
    b4x = sqrt( pow(this->a4z,2) + pow(this->a4x+this->a5x,2) );
    //std::cout << "b4x:\n" << b4x << std::endl;
    if(rho >= (this->a3z+b4x)){
        // It is not possible to reach that point
        std::cout << "Error: impossible to reach that point" << std::endl;
        return jAct;
    }
    if(rho <= abs(a3z-b4x)){
        // J2 too close to the robot himself
        std::cout << "Error: J2 too small" << std::endl;
        return jAct;
    }

    alpha = atan2(h, l);
    cos_beta = (pow(rho,2) + pow(a3z,2) - pow(b4x,2)) / (2*rho*a3z);
    sin_beta = sqrt(1 - pow(cos_beta,2));
    beta = atan2(sin_beta, cos_beta);

    if(bUpDown){
        // DOWN solution
        J2 = M_PI_2 - alpha + beta;
    }     
    else{
        // UP solution
        J2 = M_PI_2 - alpha - beta;
    }

    double cos_gamma, sin_gamma;
    cos_gamma = (pow(a3z,2) + pow(b4x,2) - pow(rho,2)) / (2*a3z*b4x);
    sin_gamma = sqrt(1 - pow(cos_gamma,2));
    gamma = atan2(sin_gamma, cos_gamma);

    delta = atan2(this->a4x+this->a5x, this->a4z);

    J3 = M_PI - gamma - delta;

    //std::cout << "J1:\n" << J1 << std::endl;
    //std::cout << "J2:\n" << J2 << std::endl;
    //std::cout << "J3:\n" << J3 << std::endl;

    Pose pJ1, pJ23;
    pJ1.setrot(0.0, 0.0, J1);
    pJ23.setrot(0.0, (J2+J3), 0.0);
    //Matrix3d Rarm = RaroundZ(J1) * RaroundY(J2+J3);
    Matrix3d Rarm = pJ1.getR() * pJ23.getR();
    Matrix3d Rwrist = Rarm.transpose() * MP.getR();

    //Find J4, J5, J6

    Rwrist11 = Rwrist(0,0);
    Rwrist21 = Rwrist(1,0);
    Rwrist31 = Rwrist(2,0);
    Rwrist12 = Rwrist(0,1);
    Rwrist13 = Rwrist(0,2);
    Rwrist32 = Rwrist(2,1);
    Rwrist33 = Rwrist(2,2);

    if (Rwrist11 < 0.9999999) {
        if (Rwrist11 > -0.9999999) {
            //J5 = acos(Rwrist11);
            J5 = atan2( sqrt(1-pow(Rwrist11,2)) , Rwrist11 );
            J4 = atan2(Rwrist21,-Rwrist31);
            J6 = atan2(Rwrist12,Rwrist13);
        }
        else // Rwrist11 = −1 
        {
            std::cout << "Rwrist11 = -1" << std::endl;
            // Wrist singularity. J5 = 180 -> This condition is not
            // possible because the spherical wrist cannot rotate J5 = 180.
            // Not a unique solution: J6 − J4 = atan2(Rwrist32,Rwrist33)
            J5 = M_PI;
            J4 = jAct.getj4();
            J6 = atan2(Rwrist32,Rwrist33) + J4;
        }
    }
    else // Rwrist11 = +1
    {
        std::cout << "Rwrist11 = +1" << std::endl;
        // Wrist singularity. J5 = 0
        // Not a unique solution: J4 + J6 = atan2(Rwrist32,Rwrist33)
        J5 = 0;
        J4 = jAct.getj4();
        J6 = atan2(Rwrist32,Rwrist33) - J4;
    }

    Joint j(J1, J2, J3, J4, J5, J6);
    return j;
}